

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

string * __thiscall
pbrt::StratifiedSampler::ToString_abi_cxx11_(string *__return_storage_ptr__,StratifiedSampler *this)

{
  RNG *in_RAX;
  
  StringPrintf<pbrt::Point2<int>const&,int_const&,int_const&,int_const&,int_const&,bool_const&,int_const&,pbrt::RNG_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ StratifiedSampler pixel: %s sampleIndex: %d dimension: %d xPixelSamples: %d yPixelSamples: %d jitter: %s seed: %d rng: %s ]"
             ,(char *)&this->pixel,(Point2<int> *)&this->sampleIndex,&this->dimension,
             &this->xPixelSamples,&this->yPixelSamples,(int *)&this->jitter,(bool *)&this->seed,
             (int *)&this->rng,in_RAX);
  return __return_storage_ptr__;
}

Assistant:

std::string StratifiedSampler::ToString() const {
    return StringPrintf(
        "[ StratifiedSampler pixel: %s sampleIndex: %d dimension: %d "
        "xPixelSamples: %d yPixelSamples: %d jitter: %s seed: %d rng: %s ]",
        pixel, sampleIndex, dimension, xPixelSamples, yPixelSamples, jitter, seed, rng);
}